

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow(bool *p_open)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImVec2 this;
  bool bVar3;
  bool bVar4;
  ImGuiIO *pIVar5;
  char *pcVar6;
  ImDrawList **ppIVar7;
  ImGuiPopupData *pIVar8;
  ImGuiTabBar *tab_bar;
  ImGuiWindow **ppIVar9;
  char *pcVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_120;
  ImVec2 local_10c;
  ImVec2 local_104;
  float local_fc;
  char local_f8 [4];
  float font_size;
  char buf [32];
  ImRect r_1;
  ImDrawList *draw_list;
  ImGuiWindow *window_1;
  int n_1;
  ImRect r;
  int rect_n;
  undefined8 local_98;
  char *input_source_names [5];
  int n;
  ImGuiWindow *window;
  int i_1;
  int i;
  ImGuiIO *io;
  ImGuiContext *g;
  char *wrt_rects_names [7];
  bool *p_open_local;
  
  wrt_rects_names[6] = p_open;
  bVar3 = Begin("Dear ImGui Metrics",p_open,0);
  if (bVar3) {
    memcpy(&g,&PTR_anon_var_dwarf_8f74_00248700,0x38);
    pIVar2 = GImGui;
    pIVar5 = GetIO();
    pcVar6 = GetVersion();
    Text("Dear ImGui %s",pcVar6);
    Text("Application average %.3f ms/frame (%.1f FPS)",(double)(1000.0 / pIVar5->Framerate));
    Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)pIVar5->MetricsRenderVertices,
         (ulong)(uint)pIVar5->MetricsRenderIndices,
         (long)pIVar5->MetricsRenderIndices / 3 & 0xffffffff);
    Text("%d active windows (%d visible)",(ulong)(uint)pIVar5->MetricsActiveWindows,
         (ulong)(uint)pIVar5->MetricsRenderWindows);
    Text("%d active allocations",(ulong)(uint)pIVar5->MetricsActiveAllocations);
    Separator();
    ShowMetricsWindow::Funcs::NodeWindows(&pIVar2->Windows,"Windows");
    bVar3 = TreeNode("DrawList","Active DrawLists (%d)",
                     (ulong)(uint)(pIVar2->DrawDataBuilder).Layers[0].Size);
    if (bVar3) {
      for (window._4_4_ = 0; window._4_4_ < (pIVar2->DrawDataBuilder).Layers[0].Size;
          window._4_4_ = window._4_4_ + 1) {
        ppIVar7 = ImVector<ImDrawList_*>::operator[]((pIVar2->DrawDataBuilder).Layers,window._4_4_);
        ShowMetricsWindow::Funcs::NodeDrawList((ImGuiWindow *)0x0,*ppIVar7,"DrawList");
      }
      TreePop();
    }
    bVar3 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar2->OpenPopupStack).Size);
    if (bVar3) {
      for (window._0_4_ = 0; (int)window < (pIVar2->OpenPopupStack).Size;
          window._0_4_ = (int)window + 1) {
        pIVar8 = ImVector<ImGuiPopupData>::operator[](&pIVar2->OpenPopupStack,(int)window);
        pIVar1 = pIVar8->Window;
        pIVar8 = ImVector<ImGuiPopupData>::operator[](&pIVar2->OpenPopupStack,(int)window);
        if (pIVar1 == (ImGuiWindow *)0x0) {
          local_120 = "NULL";
        }
        else {
          local_120 = pIVar1->Name;
        }
        bVar3 = false;
        if (pIVar1 != (ImGuiWindow *)0x0) {
          bVar3 = (pIVar1->Flags & 0x1000000U) != 0;
        }
        pcVar6 = "";
        if (bVar3) {
          pcVar6 = " ChildWindow";
        }
        bVar3 = false;
        if (pIVar1 != (ImGuiWindow *)0x0) {
          bVar3 = (pIVar1->Flags & 0x10000000U) != 0;
        }
        pcVar10 = "";
        if (bVar3) {
          pcVar10 = " ChildMenu";
        }
        BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)pIVar8->PopupId,local_120,pcVar6,
                   pcVar10);
      }
      TreePop();
    }
    bVar3 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar2->TabBars).Data.Size);
    if (bVar3) {
      for (input_source_names[4]._4_4_ = 0;
          input_source_names[4]._4_4_ < (pIVar2->TabBars).Data.Size;
          input_source_names[4]._4_4_ = input_source_names[4]._4_4_ + 1) {
        tab_bar = ImPool<ImGuiTabBar>::GetByIndex(&pIVar2->TabBars,input_source_names[4]._4_4_);
        ShowMetricsWindow::Funcs::NodeTabBar(tab_bar);
      }
      TreePop();
    }
    bVar3 = TreeNode("Internal state");
    if (bVar3) {
      memcpy(&local_98,&DAT_00248740,0x28);
      if (pIVar2->HoveredWindow == (ImGuiWindow *)0x0) {
        local_148 = "NULL";
      }
      else {
        local_148 = pIVar2->HoveredWindow->Name;
      }
      Text("HoveredWindow: \'%s\'",local_148);
      if (pIVar2->HoveredRootWindow == (ImGuiWindow *)0x0) {
        local_150 = "NULL";
      }
      else {
        local_150 = pIVar2->HoveredRootWindow->Name;
      }
      Text("HoveredRootWindow: \'%s\'",local_150);
      Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",(double)pIVar2->HoveredIdTimer,
           (ulong)pIVar2->HoveredId,(ulong)pIVar2->HoveredIdPreviousFrame,
           (ulong)(pIVar2->HoveredIdAllowOverlap & 1));
      Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
           (double)pIVar2->ActiveIdTimer,(ulong)pIVar2->ActiveId,
           (ulong)pIVar2->ActiveIdPreviousFrame,(ulong)(pIVar2->ActiveIdAllowOverlap & 1),
           input_source_names[(ulong)pIVar2->ActiveIdSource - 1]);
      if (pIVar2->ActiveIdWindow == (ImGuiWindow *)0x0) {
        local_158 = "NULL";
      }
      else {
        local_158 = pIVar2->ActiveIdWindow->Name;
      }
      Text("ActiveIdWindow: \'%s\'",local_158);
      if (pIVar2->MovingWindow == (ImGuiWindow *)0x0) {
        local_160 = "NULL";
      }
      else {
        local_160 = pIVar2->MovingWindow->Name;
      }
      Text("MovingWindow: \'%s\'",local_160);
      if (pIVar2->NavWindow == (ImGuiWindow *)0x0) {
        local_168 = "NULL";
      }
      else {
        local_168 = pIVar2->NavWindow->Name;
      }
      Text("NavWindow: \'%s\'",local_168);
      Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar2->NavId,(ulong)pIVar2->NavLayer);
      Text("NavInputSource: %s",input_source_names[(ulong)pIVar2->NavInputSource - 1]);
      Text("NavActive: %d, NavVisible: %d",(ulong)((pIVar2->IO).NavActive & 1),
           (ulong)((pIVar2->IO).NavVisible & 1));
      Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)pIVar2->NavActivateId,
           (ulong)pIVar2->NavInputId);
      Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",
           (ulong)(pIVar2->NavDisableHighlight & 1),(ulong)(pIVar2->NavDisableMouseHover & 1));
      if (pIVar2->NavWindowingTarget == (ImGuiWindow *)0x0) {
        local_170 = "NULL";
      }
      else {
        local_170 = pIVar2->NavWindowingTarget->Name;
      }
      Text("NavWindowingTarget: \'%s\'",local_170);
      Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",
           (ulong)(pIVar2->DragDropActive & 1),(ulong)(pIVar2->DragDropPayload).SourceId,
           (pIVar2->DragDropPayload).DataType,(ulong)(uint)(pIVar2->DragDropPayload).DataSize);
      TreePop();
    }
    bVar3 = TreeNode("Tools");
    if (bVar3) {
      ImVec2::ImVec2((ImVec2 *)&r.Max.y,0.0,0.0);
      bVar3 = Button("Item Picker..",(ImVec2 *)&r.Max.y);
      if (bVar3) {
        DebugStartItemPicker();
      }
      Checkbox("Show windows begin order",&ShowMetricsWindow::show_windows_begin_order);
      Checkbox("Show windows rectangles",&ShowMetricsWindow::show_windows_rects);
      SameLine(0.0,-1.0);
      fVar11 = GetFontSize();
      SetNextItemWidth(fVar11 * 12.0);
      bVar4 = Combo("##show_windows_rect_type",&ShowMetricsWindow::show_windows_rect_type,
                    (char **)&g,7,-1);
      bVar3 = (ShowMetricsWindow::show_windows_rects & 1U) != 0;
      ShowMetricsWindow::show_windows_rects = bVar3 || bVar4;
      if ((bVar3 || bVar4) && (pIVar2->NavWindow != (ImGuiWindow *)0x0)) {
        BulletText("\'%s\':",pIVar2->NavWindow->Name);
        Indent(0.0);
        for (r.Max.x = 0.0; (int)r.Max.x < 7; r.Max.x = (float)((int)r.Max.x + 1)) {
          join_0x00001240_0x00001200_ =
               ShowMetricsWindow::Funcs::GetWindowRect(pIVar2->NavWindow,(int)r.Max.x);
          dVar13 = (double)window_1._4_4_;
          dVar14 = (double)(float)n_1;
          dVar15 = (double)r.Min.x;
          dVar16 = (double)r.Min.y;
          fVar11 = ImRect::GetWidth((ImRect *)((long)&window_1 + 4));
          fVar12 = ImRect::GetHeight((ImRect *)((long)&window_1 + 4));
          Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",dVar13,dVar14,dVar15,dVar16,
               (double)fVar11,(double)fVar12,wrt_rects_names[(long)(int)r.Max.x + -1]);
        }
        Unindent(0.0);
      }
      Checkbox("Show clipping rectangle when hovering ImDrawCmd node",
               &ShowMetricsWindow::show_drawcmd_clip_rects);
      TreePop();
    }
    if (((ShowMetricsWindow::show_windows_rects & 1U) != 0) ||
       ((ShowMetricsWindow::show_windows_begin_order & 1U) != 0)) {
      for (window_1._0_4_ = 0; (int)window_1 < (pIVar2->Windows).Size;
          window_1._0_4_ = (int)window_1 + 1) {
        ppIVar9 = ImVector<ImGuiWindow_*>::operator[](&pIVar2->Windows,(int)window_1);
        pIVar1 = *ppIVar9;
        if ((pIVar1->WasActive & 1U) != 0) {
          r_1.Max = (ImVec2)GetForegroundDrawList(pIVar1);
          if ((ShowMetricsWindow::show_windows_rects & 1U) != 0) {
            join_0x00001240_0x00001200_ =
                 ShowMetricsWindow::Funcs::GetWindowRect
                           (pIVar1,ShowMetricsWindow::show_windows_rect_type);
            ImDrawList::AddRect((ImDrawList *)r_1.Max,(ImVec2 *)(buf + 0x18),&r_1.Min,0xff8000ff,0.0
                                ,0xf,1.0);
          }
          if (((ShowMetricsWindow::show_windows_begin_order & 1U) != 0) &&
             ((pIVar1->Flags & 0x1000000U) == 0)) {
            ImFormatString(local_f8,0x20,"%d",(ulong)(uint)(int)pIVar1->BeginOrderWithinContext);
            local_fc = GetFontSize();
            this = r_1.Max;
            ImVec2::ImVec2(&local_10c,local_fc,local_fc);
            local_104 = operator+(&pIVar1->Pos,&local_10c);
            ImDrawList::AddRectFilled((ImDrawList *)this,&pIVar1->Pos,&local_104,0xff6464c8,0.0,0xf)
            ;
            ImDrawList::AddText((ImDrawList *)r_1.Max,&pIVar1->Pos,0xffffffff,local_f8,(char *)0x0);
          }
        }
      }
    }
    End();
  }
  else {
    End();
  }
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!ImGui::Begin("Dear ImGui Metrics", p_open))
    {
        ImGui::End();
        return;
    }

    // State
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Contents, WRT_ContentsRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Contents", "ContentsRegionRect" };
    static bool show_windows_rects = false;
    static int  show_windows_rect_type = WRT_WorkRect;
    static bool show_windows_begin_order = false;
    static bool show_drawcmd_clip_rects = true;

    // Basic info
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = ImGui::GetIO();
    ImGui::Text("Dear ImGui %s", ImGui::GetVersion());
    ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    ImGui::Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    ImGui::Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    ImGui::Text("%d active allocations", io.MetricsActiveAllocations);
    ImGui::Separator();

    // Helper functions to display common structures:
    // - NodeDrawList
    // - NodeColumns
    // - NodeWindow
    // - NodeWindows
    // - NodeTabBar
    struct Funcs
    {
        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Contents)             { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentsRegionRect)   { return window->ContentsRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }

        static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f,0.4f,0.4f,1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            if (window && !window->WasActive)
                ImGui::Text("(Note: owning Window is inactive: DrawList is not being rendered!)");

            int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }
                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                char buf[300];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "Draw %4d triangles, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                    pcmd->ElemCount/3, (void*)(intptr_t)pcmd->TextureId, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
                if (show_drawcmd_clip_rects && fg_draw_list && ImGui::IsItemHovered())
                {
                    ImRect clip_rect = pcmd->ClipRect;
                    ImRect vtxs_rect;
                    for (int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                        vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                    clip_rect.Floor(); fg_draw_list->AddRect(clip_rect.Min, clip_rect.Max, IM_COL32(255,0,255,255));
                    vtxs_rect.Floor(); fg_draw_list->AddRect(vtxs_rect.Min, vtxs_rect.Max, IM_COL32(255,255,0,255));
                }
                if (!pcmd_node_open)
                    continue;

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGui::Text("ElemCount: %d, ElemCount/3: %d, VtxOffset: +%d, IdxOffset: +%d", pcmd->ElemCount, pcmd->ElemCount/3, pcmd->VtxOffset, pcmd->IdxOffset);
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangles_pos[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            int vtx_i = idx_buffer ? idx_buffer[idx_i] : idx_i;
                            ImDrawVert& v = draw_list->VtxBuffer[vtx_i];
                            triangles_pos[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "elem" : "    ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }
                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines at is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangles_pos, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }

        static void NodeColumns(const ImGuiColumns* columns)
        {
            if (!ImGui::TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
                return;
            ImGui::BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->OffMaxX - columns->OffMinX, columns->OffMinX, columns->OffMaxX);
            for (int column_n = 0; column_n < columns->Columns.Size; column_n++)
                ImGui::BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", column_n, columns->Columns[column_n].OffsetNorm, GetColumnOffsetFromNorm(columns, columns->Columns[column_n].OffsetNorm));
            ImGui::TreePop();
        }

        static void NodeWindows(ImVector<ImGuiWindow*>& windows, const char* label)
        {
            if (!ImGui::TreeNode(label, "%s (%d)", label, windows.Size))
                return;
            for (int i = 0; i < windows.Size; i++)
                Funcs::NodeWindow(windows[i], "Window");
            ImGui::TreePop();
        }

        static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (window == NULL)
            {
                ImGui::BulletText("%s: NULL", label);
                return;
            }
            if (!ImGui::TreeNode(window, "%s '%s', %d @ 0x%p", label, window->Name, (window->Active || window->WasActive), window))
                return;
            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y);
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    NodeColumns(&window->ColumnsStorage[n]);
                ImGui::TreePop();
            }
            ImGui::BulletText("Storage: %d bytes", window->StateStorage.Data.size_in_bytes());
            ImGui::TreePop();
        }

        static void NodeTabBar(ImGuiTabBar* tab_bar)
        {
            // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
            char buf[256];
            char* p = buf;
            const char* buf_end = buf + IM_ARRAYSIZE(buf);
            ImFormatString(p, buf_end - p, "TabBar (%d tabs)%s", tab_bar->Tabs.Size, (tab_bar->PrevFrameVisible < ImGui::GetFrameCount() - 2) ? " *Inactive*" : "");
            if (ImGui::TreeNode(tab_bar, "%s", buf))
            {
                for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
                {
                    const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
                    ImGui::PushID(tab);
                    if (ImGui::SmallButton("<")) { TabBarQueueChangeTabOrder(tab_bar, tab, -1); } ImGui::SameLine(0, 2);
                    if (ImGui::SmallButton(">")) { TabBarQueueChangeTabOrder(tab_bar, tab, +1); } ImGui::SameLine();
                    ImGui::Text("%02d%c Tab 0x%08X", tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID);
                    ImGui::PopID();
                }
                ImGui::TreePop();
            }
        }
    };

    Funcs::NodeWindows(g.Windows, "Windows");
    if (ImGui::TreeNode("DrawList", "Active DrawLists (%d)", g.DrawDataBuilder.Layers[0].Size))
    {
        for (int i = 0; i < g.DrawDataBuilder.Layers[0].Size; i++)
            Funcs::NodeDrawList(NULL, g.DrawDataBuilder.Layers[0][i], "DrawList");
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            ImGui::BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.Data.Size))
    {
        for (int n = 0; n < g.TabBars.Data.Size; n++)
            Funcs::NodeTabBar(g.TabBars.GetByIndex(n));
        ImGui::TreePop();
    }

#if 0
    if (ImGui::TreeNode("Docking"))
    {
        ImGui::TreePop();
    }
#endif

#if 0
    if (ImGui::TreeNode("Tables", "Tables (%d)", g.Tables.Data.Size))
    {
        ImGui::TreePop();
    }
#endif

    if (ImGui::TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Nav", "NavKeyboard", "NavGamepad" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);
        ImGui::Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        ImGui::Text("HoveredRootWindow: '%s'", g.HoveredRootWindow ? g.HoveredRootWindow->Name : "NULL");
        ImGui::Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        ImGui::Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        ImGui::Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        ImGui::Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        ImGui::Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        ImGui::Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        ImGui::Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        ImGui::Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        ImGui::Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        ImGui::Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        ImGui::Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        ImGui::Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("Tools"))
    {
        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (ImGui::Button("Item Picker.."))
            ImGui::DebugStartItemPicker();

        ImGui::Checkbox("Show windows begin order", &show_windows_begin_order);
        ImGui::Checkbox("Show windows rectangles", &show_windows_rects);
        ImGui::SameLine();
        ImGui::SetNextItemWidth(ImGui::GetFontSize() * 12);
        show_windows_rects |= ImGui::Combo("##show_windows_rect_type", &show_windows_rect_type, wrt_rects_names, WRT_Count);
        if (show_windows_rects && g.NavWindow)
        {
            ImGui::BulletText("'%s':", g.NavWindow->Name);
            ImGui::Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                ImGui::Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            ImGui::Unindent();
        }
        ImGui::Checkbox("Show clipping rectangle when hovering ImDrawCmd node", &show_drawcmd_clip_rects);
        ImGui::TreePop();
    }

    // Tool: Display windows Rectangles and Begin Order
    if (show_windows_rects || show_windows_begin_order)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (show_windows_rects)
            {
                ImRect r = Funcs::GetWindowRect(window, show_windows_rect_type);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (show_windows_begin_order && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = ImGui::GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }
    ImGui::End();
}